

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O0

int __thiscall
LASreadItemCompressed_BYTE14_v4::init(LASreadItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  BOOL BVar2;
  ByteStreamIn *pBVar3;
  ulong uVar4;
  ByteStreamInArray **ppBVar5;
  ByteStreamInArrayLE *this_00;
  ByteStreamInArrayBE *this_01;
  ArithmeticDecoder **ppAVar6;
  ArithmeticDecoder *this_02;
  U8 *pUVar7;
  uint7 extraout_var;
  U32 *in_RDX;
  uint local_4c;
  uint local_48;
  U32 c;
  U32 num_bytes;
  ByteStreamIn *instream;
  U32 i;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_BYTE14_v4 *this_local;
  
  pBVar3 = ArithmeticDecoder::getByteStreamIn(this->dec);
  if (this->instream_Bytes == (ByteStreamInArray **)0x0) {
    auVar1 = ZEXT416(this->number) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppBVar5 = (ByteStreamInArray **)operator_new__(uVar4);
    this->instream_Bytes = ppBVar5;
    BVar2 = IS_LITTLE_ENDIAN();
    if (BVar2) {
      for (instream._4_4_ = 0; instream._4_4_ < this->number; instream._4_4_ = instream._4_4_ + 1) {
        this_00 = (ByteStreamInArrayLE *)operator_new(0x38);
        ByteStreamInArrayLE::ByteStreamInArrayLE(this_00);
        this->instream_Bytes[instream._4_4_] = (ByteStreamInArray *)this_00;
      }
    }
    else {
      for (instream._4_4_ = 0; instream._4_4_ < this->number; instream._4_4_ = instream._4_4_ + 1) {
        this_01 = (ByteStreamInArrayBE *)operator_new(0x38);
        ByteStreamInArrayBE::ByteStreamInArrayBE(this_01);
        this->instream_Bytes[instream._4_4_] = (ByteStreamInArray *)this_01;
      }
    }
    auVar1 = ZEXT416(this->number) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppAVar6 = (ArithmeticDecoder **)operator_new__(uVar4);
    this->dec_Bytes = ppAVar6;
    for (instream._4_4_ = 0; instream._4_4_ < this->number; instream._4_4_ = instream._4_4_ + 1) {
      this_02 = (ArithmeticDecoder *)operator_new(0x10);
      ArithmeticDecoder::ArithmeticDecoder(this_02);
      this->dec_Bytes[instream._4_4_] = this_02;
    }
  }
  local_48 = 0;
  for (instream._4_4_ = 0; instream._4_4_ < this->number; instream._4_4_ = instream._4_4_ + 1) {
    if ((this->requested_Bytes[instream._4_4_] & 1U) != 0) {
      local_48 = this->num_bytes_Bytes[instream._4_4_] + local_48;
    }
  }
  if (this->num_bytes_allocated < local_48) {
    if ((this->bytes != (U8 *)0x0) && (this->bytes != (U8 *)0x0)) {
      operator_delete__(this->bytes);
    }
    pUVar7 = (U8 *)operator_new__((ulong)local_48);
    this->bytes = pUVar7;
    if (this->bytes == (U8 *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_0016008e;
    }
    this->num_bytes_allocated = local_48;
  }
  local_48 = 0;
  for (instream._4_4_ = 0; instream._4_4_ < this->number; instream._4_4_ = instream._4_4_ + 1) {
    if ((this->requested_Bytes[instream._4_4_] & 1U) == 0) {
      if (this->num_bytes_Bytes[instream._4_4_] != 0) {
        (*pBVar3->_vptr_ByteStreamIn[0xc])(pBVar3,(ulong)this->num_bytes_Bytes[instream._4_4_]);
      }
      this->changed_Bytes[instream._4_4_] = false;
    }
    else if (this->num_bytes_Bytes[instream._4_4_] == 0) {
      ArithmeticDecoder::init(this->dec_Bytes[instream._4_4_],(EVP_PKEY_CTX *)0x0);
      this->changed_Bytes[instream._4_4_] = false;
    }
    else {
      (*pBVar3->_vptr_ByteStreamIn[1])
                (pBVar3,this->bytes + local_48,(ulong)this->num_bytes_Bytes[instream._4_4_]);
      ByteStreamInArray::init
                (this->instream_Bytes[instream._4_4_],(EVP_PKEY_CTX *)(this->bytes + local_48));
      ArithmeticDecoder::init
                (this->dec_Bytes[instream._4_4_],
                 (EVP_PKEY_CTX *)this->instream_Bytes[instream._4_4_]);
      local_48 = this->num_bytes_Bytes[instream._4_4_] + local_48;
      this->changed_Bytes[instream._4_4_] = true;
    }
  }
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    this->contexts[local_4c].unused = true;
  }
  this->current_context = *in_RDX;
  createAndInitModelsAndDecompressors(this,this->current_context,(U8 *)ctx);
  this = (LASreadItemCompressed_BYTE14_v4 *)((ulong)extraout_var << 8);
  this_local._7_1_ = 1;
LAB_0016008e:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

BOOL LASreadItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* on the first init create instreams and decoders */

  if (instream_Bytes == 0)
  {
    /* create instream pointer array */

    instream_Bytes = new ByteStreamInArray*[number];

    /* create instreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayBE();
      }
    }

    /* create decoder pointer array */

    dec_Bytes = new ArithmeticDecoder*[number];

    /* create layer decoders */

    for (i = 0; i < number; i++)
    {
      dec_Bytes[i] = new ArithmeticDecoder();
    }
  }

  /* how many bytes do we need to read */

  U32 num_bytes = 0;

  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i]) num_bytes += num_bytes_Bytes[i];
  }

  /* make sure the buffer is sufficiently large */

  if (num_bytes > num_bytes_allocated)
  {
    if (bytes) delete [] bytes;
    bytes = new U8[num_bytes];
    if (bytes == 0) return FALSE;
    num_bytes_allocated = num_bytes;
  }

  /* load the requested bytes and init the corresponding instreams an decoders */

  num_bytes = 0;
  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i])
    {
      if (num_bytes_Bytes[i])
      {
        instream->getBytes(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        instream_Bytes[i]->init(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        dec_Bytes[i]->init(instream_Bytes[i]);
        num_bytes += num_bytes_Bytes[i];
        changed_Bytes[i] = TRUE;
      }
      else
      {
        dec_Bytes[i]->init(0, 0);
        changed_Bytes[i] = FALSE;
      }
    }
    else
    {
      if (num_bytes_Bytes[i])
      {
        instream->skipBytes(num_bytes_Bytes[i]);
      }
      changed_Bytes[i] = FALSE;
    }
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 reader

  /* create and init models and decompressors */

  createAndInitModelsAndDecompressors(current_context, item);

  return TRUE;
}